

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  IConfig *pIVar4;
  undefined1 local_d0 [8];
  AssertionPrinter printer;
  bool printInfoMessages;
  AssertionResult *result;
  AssertionStats *_assertionStats_local;
  ConsoleReporter *this_local;
  
  printer._159_1_ = 1;
  pIVar4 = Ptr<Catch::IConfig>::operator->(&(this->super_StreamingReporterBase).m_config);
  uVar2 = (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[7])();
  if (((uVar2 & 1) == 0) &&
     (bVar1 = AssertionResult::isOk(&_assertionStats->assertionResult), bVar1)) {
    OVar3 = AssertionResult::getResultType(&_assertionStats->assertionResult);
    if (OVar3 != Warning) {
      return false;
    }
    printer._159_1_ = 0;
  }
  lazyPrint(this);
  AssertionPrinter::AssertionPrinter
            ((AssertionPrinter *)local_d0,(this->super_StreamingReporterBase).stream,_assertionStats
             ,(bool)(printer._159_1_ & 1));
  AssertionPrinter::print((AssertionPrinter *)local_d0);
  std::ostream::operator<<
            ((this->super_StreamingReporterBase).stream,std::endl<char,std::char_traits<char>>);
  AssertionPrinter::~AssertionPrinter((AssertionPrinter *)local_d0);
  return true;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning )
                    return false;
                printInfoMessages = false;
            }

            lazyPrint();

            AssertionPrinter printer( stream, _assertionStats, printInfoMessages );
            printer.print();
            stream << std::endl;
            return true;
        }